

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O2

Builder * __thiscall
capnp::compiler::Expression::Builder::initImport(Builder *__return_storage_ptr__,Builder *this)

{
  PointerBuilder local_28;
  
  *(undefined2 *)(this->_builder).data = 0xc;
  local_28.pointer = (this->_builder).pointers;
  local_28.segment = (this->_builder).segment;
  local_28.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::initStruct
            (&__return_storage_ptr__->_builder,&local_28,(StructSize)0x10001);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::compiler::LocatedText::Builder Expression::Builder::initImport() {
  _builder.setDataField<Expression::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Expression::IMPORT);
  return ::capnp::_::PointerHelpers< ::capnp::compiler::LocatedText>::init(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS));
}